

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

bool __thiscall
vkb::PhysicalDevice::enable_extension_if_present(PhysicalDevice *this,char *extension)

{
  pointer pbVar1;
  int iVar2;
  long lVar3;
  pointer pbVar4;
  pointer pbVar5;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar5 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)pbVar5 >> 7;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      iVar2 = std::__cxx11::string::compare((char *)pbVar5);
      pbVar4 = pbVar5;
      if (iVar2 == 0) goto LAB_0011f30e;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 1));
      pbVar4 = pbVar5 + 1;
      if (iVar2 == 0) goto LAB_0011f30e;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 2));
      pbVar4 = pbVar5 + 2;
      if (iVar2 == 0) goto LAB_0011f30e;
      iVar2 = std::__cxx11::string::compare((char *)(pbVar5 + 3));
      pbVar4 = pbVar5 + 3;
      if (iVar2 == 0) goto LAB_0011f30e;
      pbVar5 = pbVar5 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pbVar1 - (long)pbVar5 >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pbVar4 = pbVar1;
      if ((lVar3 != 3) ||
         (iVar2 = std::__cxx11::string::compare((char *)pbVar5), pbVar4 = pbVar5, iVar2 == 0))
      goto LAB_0011f30e;
      pbVar5 = pbVar5 + 1;
    }
    iVar2 = std::__cxx11::string::compare((char *)pbVar5);
    pbVar4 = pbVar5;
    if (iVar2 == 0) goto LAB_0011f30e;
    pbVar5 = pbVar5 + 1;
  }
  iVar2 = std::__cxx11::string::compare((char *)pbVar5);
  pbVar4 = pbVar1;
  if (iVar2 == 0) {
    pbVar4 = pbVar5;
  }
LAB_0011f30e:
  pbVar5 = (this->available_extensions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar5) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,extension,&local_51);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->extensions_to_enable,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return pbVar4 != pbVar5;
}

Assistant:

bool PhysicalDevice::enable_extension_if_present(const char* extension) {
    auto it = std::find_if(std::begin(available_extensions),
        std::end(available_extensions),
        [extension](std::string const& ext_name) { return ext_name == extension; });
    if (it != std::end(available_extensions)) {
        extensions_to_enable.push_back(extension);
        return true;
    }
    return false;
}